

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O3

void __thiscall
FZipExploder::InsertCode
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          uint pos,int bits,unsigned_short code,int len,uchar value)

{
  uint uVar1;
  HuffNode *pHVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar8 = (uint)code;
  if (0 < len) {
    uVar7 = (ulong)pos;
    do {
      bVar5 = (byte)bits;
      uVar4 = (~(-1 << (bVar5 & 0x1f)) & uVar8 & 0xffff) + (int)uVar7;
      if (len <= bits) {
        if (bits - len != 0x1f) {
          pHVar2 = decoder->Array;
          iVar6 = -(-1 << ((byte)(bits - len) & 0x1f));
          do {
            pHVar2[uVar4].Length = (byte)len;
            pHVar2[uVar4].Value = value;
            if (pHVar2[uVar4].ChildTable != 0) {
              __assert_fail("decoder[node].ChildTable == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                            ,0x7d,
                            "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                           );
            }
            uVar4 = uVar4 + (1 << ((byte)len & 0x1f));
            iVar6 = iVar6 + -1;
          } while (0 < iVar6);
        }
        return;
      }
      pHVar2 = decoder->Array;
      uVar7 = (ulong)pHVar2[uVar4].ChildTable;
      if (pHVar2[uVar4].ChildTable == 0) {
        uVar1 = decoder->Count;
        uVar7 = (ulong)uVar1;
        TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::Grow(decoder,0x10);
        decoder->Count = decoder->Count + 0x10;
        pHVar2 = decoder->Array;
        *(undefined8 *)(pHVar2 + uVar7 + 0xc) = 0;
        *(undefined8 *)(pHVar2 + uVar7 + 0xc + 2) = 0;
        *(undefined8 *)(pHVar2 + uVar7 + 8) = 0;
        *(undefined8 *)(pHVar2 + uVar7 + 8 + 2) = 0;
        *(undefined8 *)(pHVar2 + uVar7 + 4) = 0;
        *(undefined8 *)(pHVar2 + uVar7 + 4 + 2) = 0;
        *(undefined8 *)(pHVar2 + uVar7) = 0;
        *(undefined8 *)(pHVar2 + uVar7 + 2) = 0;
        pHVar2 = decoder->Array;
        pHVar2[uVar4].ChildTable = (unsigned_short)uVar1;
        pHVar2[uVar4].Length = bVar5;
        pHVar2[uVar4].Value = '\0';
      }
      else {
        if (bits != (uint)pHVar2[uVar4].Length) {
          __assert_fail("decoder[node].Length == bits",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                        ,0x70,
                        "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                       );
        }
        if (pHVar2[uVar4].Value != '\0') {
          __assert_fail("decoder[node].Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                        ,0x71,
                        "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
                       );
        }
      }
      uVar8 = (uVar8 & 0xffff) >> (bVar5 & 0x1f);
      iVar6 = len - bits;
      bVar3 = bits <= len;
      len = iVar6;
      bits = 4;
    } while (iVar6 != 0 && bVar3);
  }
  __assert_fail("len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/resourcefiles/ancientzip.cpp"
                ,0x60,
                "void FZipExploder::InsertCode(TArray<HuffNode> &, unsigned int, int, unsigned short, int, unsigned char)"
               );
}

Assistant:

void FZipExploder::InsertCode(TArray<HuffNode> &decoder, unsigned int pos, int bits, unsigned short code, int len, unsigned char value)
{
	assert(len > 0);
	unsigned int node = pos + (code & ((1 << bits) - 1));

	if (len > bits)
	{ // This code uses more bits than this level has room for. Store the bottom bits
	  // in this table, then proceed to the next one.
		unsigned int child = decoder[node].ChildTable;
		if (child == 0)
		{ // Need to create child table.
			child = InitTable(decoder, 1 << REST_BIT_LEN);
			decoder[node].ChildTable = child;
			decoder[node].Length = bits;
			decoder[node].Value = 0;
		}
		else
		{
			assert(decoder[node].Length == bits);
			assert(decoder[node].Value == 0);
		}
		InsertCode(decoder, child, REST_BIT_LEN, code >> bits, len - bits, value);
	}
	else
	{ // If this code uses fewer bits than this level of the table, it is
	  // inserted repeatedly for each value that matches it at its lower
	  // bits.
		for (int i = 1 << (bits - len); --i >= 0; node += 1 << len)
		{
			decoder[node].Length = len;
			decoder[node].Value = value;
			assert(decoder[node].ChildTable == 0);
		}
	}
}